

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_splitter.hpp
# Opt level: O1

void pstore::dump::
     expand_tabs<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>>
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                first,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      last,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               out,size_t tab_size)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  if (first._M_current != last._M_current) {
    uVar3 = 0;
    do {
      if (*first._M_current == '\t') {
        lVar1 = tab_size - uVar3 % tab_size;
        for (lVar2 = lVar1; lVar2 != 0; lVar2 = lVar2 + -1) {
          std::__cxx11::string::push_back((char)out.container);
        }
        uVar3 = uVar3 + lVar1;
      }
      else {
        std::__cxx11::string::push_back((char)out.container);
        uVar3 = uVar3 + 1;
      }
      first._M_current = first._M_current + 1;
    } while (first._M_current != last._M_current);
  }
  return;
}

Assistant:

void expand_tabs (InputIterator first, InputIterator last, OutputIterator out,
                          std::size_t const tab_size = 4) {
            auto position = std::size_t{0};
            for (; first != last; ++first) {
                auto const c = *first;
                if (c != '\t') {
                    *(out++) = c;
                    ++position;
                } else {
                    auto const spaces = tab_size - (position % tab_size);
                    out = std::fill_n (out, spaces, ' ');
                    position += spaces;
                }
            }
        }